

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O3

GenValidUsageXrHandleInfo * __thiscall
HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>::get
          (HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo> *this,
          XrWorldMeshDetectorML_T *handle)

{
  GenValidUsageXrHandleInfo *pGVar1;
  iterator iVar2;
  UniqueLock lock;
  string local_48;
  XrWorldMeshDetectorML_T *local_28;
  unique_lock<std::mutex> local_20;
  
  local_28 = handle;
  if (handle == (XrWorldMeshDetectorML_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::get()","");
    reportInternalError(&local_48);
  }
  local_20._M_device = &this->dispatch_mutex_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  iVar2 = std::
          _Hashtable<XrWorldMeshDetectorML_T_*,_std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrWorldMeshDetectorML_T_*>,_std::hash<XrWorldMeshDetectorML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrWorldMeshDetectorML_T_*,_std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrWorldMeshDetectorML_T_*>,_std::hash<XrWorldMeshDetectorML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  if (iVar2.
      super__Node_iterator_base<std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pGVar1 = *(GenValidUsageXrHandleInfo **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<XrWorldMeshDetectorML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
                     ._M_cur + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    return pGVar1;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Handle passed to HandleInfoBase::insert() not inserted","");
  reportInternalError(&local_48);
}

Assistant:

inline InfoType *HandleInfoBase<HandleType, InfoType>::get(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::get()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    return entry_returned->second.get();
}